

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O2

bool gpt2_eval(gpt2_model *model,int n_threads,int n_past,
              vector<int,_std::allocator<int>_> *embd_inp,
              vector<float,_std::allocator<float>_> *embd_w,size_t *mem_per_token)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  void *__dest;
  ggml_tensor *pgVar7;
  pointer __dest_00;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  long lVar19;
  undefined8 uVar20;
  long lVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  long local_138;
  long local_128;
  long local_d0;
  undefined8 extraout_XMM0_Qb;
  
  piVar5 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar6 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar1 = (model->hparams).n_embd;
  lVar9 = (long)iVar1;
  uVar2 = (model->hparams).n_layer;
  lVar10 = (long)(model->hparams).n_ctx;
  iVar3 = (model->hparams).n_head;
  lVar11 = (long)iVar3;
  iVar4 = (model->hparams).n_vocab;
  if ((gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
       ::buf == '\0') &&
     (iVar8 = __cxa_guard_acquire(&gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
                                   ::buf), iVar8 != 0)) {
    gpt2_eval::buf = malloc(gpt2_eval::buf_size);
    __cxa_guard_release(&gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
                         ::buf);
  }
  uVar26 = (ulong)((long)piVar5 - (long)piVar6) >> 2;
  iVar8 = (int)uVar26;
  if ((*mem_per_token != 0) &&
     (uVar24 = *mem_per_token * (long)iVar8,
     gpt2_eval::buf_size <= uVar24 && uVar24 - gpt2_eval::buf_size != 0)) {
    auVar29._8_4_ = (int)(uVar24 >> 0x20);
    auVar29._0_8_ = uVar24;
    auVar29._12_4_ = 0x45300000;
    dVar33 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0)) * 1.1;
    uVar24 = (ulong)dVar33;
    uVar24 = (long)(dVar33 - 9.223372036854776e+18) & (long)uVar24 >> 0x3f | uVar24;
    gpt2_eval::buf_size = uVar24;
    gpt2_eval::buf = realloc(gpt2_eval::buf,uVar24);
    if (gpt2_eval::buf == (void *)0x0) {
      fprintf(_stderr,"%s: failed to allocate %zu bytes\n","gpt2_eval",uVar24);
      return false;
    }
  }
  uVar27 = (ulong)iVar8;
  uVar12 = ggml_init();
  uVar13 = ggml_new_graph(uVar12);
  lVar14 = ggml_new_tensor_1d(uVar12,0x1a,uVar27);
  __dest = *(void **)(lVar14 + 0xf8);
  piVar5 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar15 = ggml_element_size(lVar14);
  memcpy(__dest,piVar5,lVar15 * uVar27);
  lVar15 = ggml_new_tensor_1d(uVar12,0x1a,uVar27);
  uVar24 = 0;
  uVar25 = 0;
  if (0 < iVar8) {
    uVar25 = uVar26 & 0xffffffff;
  }
  for (; uVar25 != uVar24; uVar24 = uVar24 + 1) {
    *(int *)(*(long *)(lVar15 + 0xf8) + uVar24 * 4) = n_past + (int)uVar24;
  }
  uVar16 = ggml_get_rows(uVar12,model->wte,lVar14);
  uVar17 = ggml_get_rows(uVar12,model->wpe,lVar15);
  uVar16 = ggml_add(uVar12,uVar16,uVar17);
  lVar15 = (long)(n_past + iVar8);
  lVar14 = (long)((n_past + iVar8) * iVar1);
  dVar33 = (double)((float)iVar1 / (float)iVar3);
  uVar24 = 0;
  uVar26 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar26 = uVar24;
  }
  local_128 = n_past * lVar9;
  auVar30._0_8_ = SQRT(dVar33);
  local_138 = 0;
  local_d0 = 0;
  for (; uVar17 = ggml_norm(uVar12,uVar16), uVar26 * 0x60 != uVar24; uVar24 = uVar24 + 0x60) {
    uVar18 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ln_1_g +
                                 uVar24),uVar17);
    uVar18 = ggml_mul(uVar12,uVar18,uVar17);
    uVar17 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ln_1_b +
                                 uVar24),uVar17);
    uVar17 = ggml_add(uVar12,uVar18,uVar17);
    uVar17 = ggml_mul_mat(uVar12,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_w
                                  + uVar24),uVar17);
    uVar18 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_b
                                 + uVar24),uVar17);
    lVar19 = ggml_add(uVar12,uVar18,uVar17);
    uVar17 = ggml_view_2d(uVar12,lVar19,lVar9,uVar27,*(undefined8 *)(lVar19 + 0x38),0);
    uVar18 = ggml_view_2d(uVar12,lVar19,lVar9,uVar27,*(undefined8 *)(lVar19 + 0x38),lVar9 * 4);
    uVar20 = ggml_view_2d(uVar12,lVar19,lVar9,uVar27,*(undefined8 *)(lVar19 + 0x38),lVar9 * 8);
    lVar19 = local_138;
    if (0 < iVar8) {
      pgVar7 = model->memory_k;
      lVar21 = ggml_element_size(pgVar7);
      lVar19 = local_d0 * lVar10;
      uVar22 = ggml_view_1d(uVar12,pgVar7,(long)(iVar1 * iVar8),lVar21 * local_128);
      pgVar7 = model->memory_v;
      lVar21 = ggml_element_size(pgVar7);
      uVar23 = ggml_view_1d(uVar12,pgVar7,(long)(iVar1 * iVar8),lVar21 * local_128);
      uVar18 = ggml_cpy(uVar12,uVar18,uVar22);
      ggml_build_forward_expand(uVar13,uVar18);
      uVar18 = ggml_cpy(uVar12,uVar20,uVar23);
      ggml_build_forward_expand(uVar13,uVar18);
    }
    lVar28 = (long)(iVar1 / iVar3);
    uVar18 = ggml_new_tensor_3d(uVar12,0,lVar28,lVar11,uVar27);
    uVar17 = ggml_cpy(uVar12,uVar17,uVar18);
    uVar17 = ggml_permute(uVar12,uVar17,0,2,1,3);
    pgVar7 = model->memory_k;
    lVar21 = ggml_element_size(pgVar7);
    uVar18 = ggml_view_1d(uVar12,pgVar7,lVar14,lVar21 * lVar19 * lVar9);
    uVar18 = ggml_reshape_3d(uVar12,uVar18,lVar28,lVar11,lVar15);
    uVar18 = ggml_permute(uVar12,uVar18,0,2,1,3);
    uVar17 = ggml_mul_mat(uVar12,uVar18,uVar17);
    auVar30._8_8_ = 0;
    auVar31 = auVar30;
    if (dVar33 < 0.0) {
      auVar31._0_8_ = sqrt(dVar33);
      auVar31._8_8_ = extraout_XMM0_Qb;
    }
    auVar32._4_12_ = auVar31._4_12_;
    auVar32._0_4_ = (float)(1.0 / auVar31._0_8_);
    uVar17 = ggml_scale_inplace(auVar32._0_8_,uVar12,uVar17);
    uVar17 = ggml_diag_mask_inf_inplace(uVar12,uVar17,n_past);
    uVar17 = ggml_soft_max_inplace(uVar12,uVar17);
    pgVar7 = model->memory_v;
    lVar21 = ggml_element_size(pgVar7);
    uVar18 = ggml_view_1d(uVar12,pgVar7,lVar14,lVar19 * lVar9 * lVar21);
    uVar18 = ggml_reshape_3d(uVar12,uVar18,lVar28,lVar11,lVar15);
    uVar18 = ggml_permute(uVar12,uVar18,1,2,0,3);
    uVar20 = ggml_new_tensor_3d(uVar12,model->memory_v->type,lVar15,lVar28,lVar11);
    uVar18 = ggml_cpy(uVar12,uVar18,uVar20);
    uVar17 = ggml_mul_mat(uVar12,uVar18,uVar17);
    uVar17 = ggml_permute(uVar12,uVar17,0,2,1);
    uVar18 = ggml_new_tensor_2d(uVar12,0,lVar9,uVar27);
    uVar17 = ggml_cpy(uVar12,uVar17,uVar18);
    uVar17 = ggml_mul_mat(uVar12,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_w
                                  + uVar24),uVar17);
    uVar18 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_b
                                 + uVar24),uVar17);
    uVar17 = ggml_add(uVar12,uVar18,uVar17);
    uVar16 = ggml_add(uVar12,uVar17,uVar16);
    uVar17 = ggml_norm(uVar12,uVar16);
    uVar18 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ln_2_g +
                                 uVar24),uVar17);
    uVar18 = ggml_mul(uVar12,uVar18,uVar17);
    uVar17 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ln_2_b +
                                 uVar24),uVar17);
    uVar17 = ggml_add(uVar12,uVar18,uVar17);
    uVar17 = ggml_mul_mat(uVar12,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                  uVar24),uVar17);
    uVar18 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_b +
                                 uVar24),uVar17);
    uVar17 = ggml_add(uVar12,uVar18,uVar17);
    uVar17 = ggml_gelu(uVar12,uVar17);
    uVar17 = ggml_mul_mat(uVar12,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w
                                  + uVar24),uVar17);
    uVar18 = ggml_repeat(uVar12,*(undefined8 *)
                                 ((long)&((model->layers).
                                          super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_b +
                                 uVar24),uVar17);
    uVar17 = ggml_add(uVar12,uVar18,uVar17);
    uVar16 = ggml_add(uVar12,uVar17,uVar16);
    local_d0 = local_d0 + 1;
    local_138 = local_138 + lVar10;
    local_128 = local_128 + lVar10 * lVar9;
  }
  uVar16 = ggml_repeat(uVar12,model->ln_f_g,uVar17);
  uVar16 = ggml_mul(uVar12,uVar16,uVar17);
  uVar17 = ggml_repeat(uVar12,model->ln_f_b,uVar17);
  uVar16 = ggml_add(uVar12,uVar16,uVar17);
  uVar16 = ggml_mul_mat(uVar12,model->lm_head,uVar16);
  ggml_build_forward_expand(uVar13,uVar16);
  ggml_graph_compute_with_ctx(uVar12,uVar13,n_threads);
  std::vector<float,_std::allocator<float>_>::resize(embd_w,(long)iVar4);
  __dest_00 = (embd_w->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
  lVar9 = ggml_get_data(uVar16);
  memcpy(__dest_00,(void *)(lVar9 + (long)((iVar8 + -1) * iVar4) * 4),(long)iVar4 << 2);
  if (*mem_per_token == 0) {
    uVar26 = ggml_used_mem(uVar12);
    *mem_per_token = uVar26 / uVar27;
  }
  ggml_free(uVar12);
  return true;
}

Assistant:

bool gpt2_eval(
        const gpt2_model & model,
        const int n_threads,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp,
              std::vector<float>         & embd_w,
              size_t                     & mem_per_token) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;
    const int n_vocab = hparams.n_vocab;

    static size_t buf_size = 256u*1024*1024;
    static void * buf = malloc(buf_size);

    if (mem_per_token > 0 && mem_per_token*N > buf_size) {
        const size_t buf_size_new = 1.1*(mem_per_token*N); // add 10% to account for ggml object overhead
        //printf("\n%s: reallocating buffer from %zu to %zu bytes\n", __func__, buf_size, buf_size_new);

        // reallocate
        buf_size = buf_size_new;
        buf = realloc(buf, buf_size);
        if (buf == nullptr) {
            fprintf(stderr, "%s: failed to allocate %zu bytes\n", __func__, buf_size);
            return false;
        }
    }

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf,
        /*.no_alloc   =*/ false,
    };

    struct ggml_context * ctx0 = ggml_init(params);
    struct ggml_cgraph * gf = ggml_new_graph(ctx0);

    struct ggml_tensor * embd = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, N);
    memcpy(embd->data, embd_inp.data(), N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, N);
    for (int i = 0; i < N; ++i) {
        ((int32_t *) position->data)[i] = n_past + i;
    }

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx0,
                ggml_get_rows(ctx0, model.wte, embd),
                ggml_get_rows(ctx0, model.wpe, position));

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx0, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx0,
                    ggml_mul(ctx0,
                        ggml_repeat(ctx0, model.layers[il].ln_1_g, cur),
                        cur),
                    ggml_repeat(ctx0, model.layers[il].ln_1_b, cur));
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_attn_attn_b, cur),
                    cur);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx0, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx0, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx0,
                        ggml_cpy(ctx0,
                            Qcur,
                            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_embd/n_head, n_head, N)),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx0,
                        ggml_reshape_3d(ctx0,
                            ggml_view_1d(ctx0, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale_inplace(ctx0, KQ, 1.0f/sqrt(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf_inplace(ctx0, KQ_scaled, n_past);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max_inplace(ctx0, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cpy(ctx0,
                        ggml_permute(ctx0,
                            ggml_reshape_3d(ctx0,
                                ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        ggml_new_tensor_3d(ctx0, model.memory_v->type, n_past + N, n_embd/n_head, n_head));

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cpy(ctx0,
                    KQV_merged,
                    ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, N));
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_attn_proj_b, cur),
                    cur);
        }

        // add the input
        cur = ggml_add(ctx0, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx0, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx0,
                        ggml_mul(ctx0,
                            ggml_repeat(ctx0, model.layers[il].ln_2_g, cur),
                            cur),
                        ggml_repeat(ctx0, model.layers[il].ln_2_b, cur));
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_mlp_fc_b, cur),
                    cur);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx0, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_mlp_proj_b, cur),
                    cur);
        }

        // input for next layer
        inpL = ggml_add(ctx0, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx0, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx0,
                ggml_mul(ctx0,
                    ggml_repeat(ctx0, model.ln_f_g, inpL),
                    inpL),
                ggml_repeat(ctx0, model.ln_f_b, inpL));
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx0, model.lm_head, inpL);

    // logits -> probs
    //inpL = ggml_soft_max_inplace(ctx0, inpL);

    // run the computation
    ggml_build_forward_expand(gf, inpL);
    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    //embd_w.resize(n_vocab*N);
    //memcpy(embd_w.data(), ggml_get_data(inpL), sizeof(float)*n_vocab*N);

    // return result just for the last token
    embd_w.resize(n_vocab);
    memcpy(embd_w.data(), (float *) ggml_get_data(inpL) + (n_vocab*(N-1)), sizeof(float)*n_vocab);

    if (mem_per_token == 0) {
        mem_per_token = ggml_used_mem(ctx0)/N;
    }
    //printf("used_mem = %zu\n", ggml_used_mem(ctx0));

    ggml_free(ctx0);

    return true;
}